

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFlatImage.cpp
# Opt level: O3

void anon_unknown.dwarf_bda6::verifyImagesAreEqual(FlatImage *img1,FlatImage *img2,int dx,int dy)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  FlatImageLevel *pFVar5;
  FlatImageLevel *pFVar6;
  ArgExc *this;
  
  iVar1 = Imf_3_2::Image::levelMode();
  iVar2 = Imf_3_2::Image::levelMode();
  if (iVar1 == iVar2) {
    iVar1 = Imf_3_2::Image::levelRoundingMode();
    iVar2 = Imf_3_2::Image::levelRoundingMode();
    if (iVar1 == iVar2) {
      iVar1 = Imf_3_2::Image::numXLevels();
      iVar2 = Imf_3_2::Image::numXLevels();
      if (iVar1 == iVar2) {
        iVar1 = Imf_3_2::Image::numYLevels();
        iVar2 = Imf_3_2::Image::numYLevels();
        if (iVar1 == iVar2) {
          iVar1 = Imf_3_2::Image::levelMode();
          if (iVar1 == 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"        level 0",0xf);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
            std::ostream::put('x');
            std::ostream::flush();
            pFVar5 = (FlatImageLevel *)(**(code **)(*(long *)img1 + 0x20))(img1,0);
            pFVar6 = (FlatImageLevel *)(**(code **)(*(long *)img2 + 0x20))(img2,0);
            verifyLevelsAreEqual(pFVar5,pFVar6,dx,dy);
            return;
          }
          if (iVar1 == 1) {
            iVar1 = Imf_3_2::Image::numLevels();
            if (0 < iVar1) {
              iVar1 = 0;
              do {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"        level ",0xe);
                poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
                std::__ostream_insert<char,std::char_traits<char>>(poVar4,"",0);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
                std::ostream::put((char)poVar4);
                std::ostream::flush();
                pFVar5 = (FlatImageLevel *)(**(code **)(*(long *)img1 + 0x20))(img1,iVar1);
                pFVar6 = (FlatImageLevel *)(**(code **)(*(long *)img2 + 0x20))(img2,iVar1);
                verifyLevelsAreEqual(pFVar5,pFVar6,dx,dy);
                iVar1 = iVar1 + 1;
                iVar2 = Imf_3_2::Image::numLevels();
              } while (iVar1 < iVar2);
            }
          }
          else {
            if (iVar1 != 2) {
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testFlatImage.cpp"
                            ,0xa3,
                            "void (anonymous namespace)::verifyImagesAreEqual(const FlatImage &, const FlatImage &, int, int)"
                           );
            }
            iVar1 = Imf_3_2::Image::numYLevels();
            if (0 < iVar1) {
              iVar1 = 0;
              do {
                iVar2 = Imf_3_2::Image::numXLevels();
                if (0 < iVar2) {
                  iVar2 = 0;
                  do {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"        level (",0xf);
                    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
                    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
                    std::ostream::put((char)poVar4);
                    std::ostream::flush();
                    pFVar5 = (FlatImageLevel *)(**(code **)(*(long *)img1 + 0x30))(img1,iVar2,iVar1)
                    ;
                    pFVar6 = (FlatImageLevel *)(**(code **)(*(long *)img2 + 0x30))(img2,iVar2,iVar1)
                    ;
                    verifyLevelsAreEqual(pFVar5,pFVar6,dx,dy);
                    iVar2 = iVar2 + 1;
                    iVar3 = Imf_3_2::Image::numXLevels();
                  } while (iVar2 < iVar3);
                }
                iVar1 = iVar1 + 1;
                iVar2 = Imf_3_2::Image::numYLevels();
              } while (iVar1 < iVar2);
            }
          }
          return;
        }
      }
      this = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::ArgExc::ArgExc(this,"different number of levels");
    }
    else {
      this = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::ArgExc::ArgExc(this,"different level rounding modes");
    }
  }
  else {
    this = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(this,"different level modes");
  }
  __cxa_throw(this,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
}

Assistant:

void
verifyImagesAreEqual (
    const FlatImage& img1, const FlatImage& img2, int dx = 0, int dy = 0)
{
    if (img1.levelMode () != img2.levelMode ())
        throw ArgExc ("different level modes");

    if (img1.levelRoundingMode () != img2.levelRoundingMode ())
        throw ArgExc ("different level rounding modes");

    if (img1.numXLevels () != img2.numXLevels () ||
        img1.numYLevels () != img2.numYLevels ())
        throw ArgExc ("different number of levels");

    switch (img1.levelMode ())
    {
        case ONE_LEVEL:

            cout << "        level 0" << endl;

            verifyLevelsAreEqual (img1.level (), img2.level (), dx, dy);

            break;

        case MIPMAP_LEVELS:

            for (int x = 0; x < img1.numLevels (); ++x)
            {
                cout << "        level " << x << "" << endl;

                verifyLevelsAreEqual (img1.level (x), img2.level (x), dx, dy);
            }

            break;

        case RIPMAP_LEVELS:

            for (int y = 0; y < img1.numYLevels (); ++y)
            {
                for (int x = 0; x < img1.numXLevels (); ++x)
                {
                    cout << "        level (" << x << ", " << y << ")" << endl;

                    verifyLevelsAreEqual (
                        img1.level (x, y), img2.level (x, y), dx, dy);
                }
            }

            break;

        default: assert (false);
    }
}